

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

Fad<double> * __thiscall
TPZMatrix<Fad<double>_>::GetRandomVal
          (Fad<double> *__return_storage_ptr__,TPZMatrix<Fad<double>_> *this)

{
  double dVar1;
  
  if (TPZMatrix<Fad<double>>::GetRandomVal()::unif == '\0') {
    TPZMatrix<Fad<double>>::GetRandomVal();
  }
  if (TPZMatrix<Fad<double>>::GetRandomVal()::re == '\0') {
    TPZMatrix<Fad<double>>::GetRandomVal();
  }
  dVar1 = std::
          generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&GetRandomVal::re);
  __return_storage_ptr__->val_ =
       (GetRandomVal::unif._M_param._M_b - GetRandomVal::unif._M_param._M_a) * dVar1 +
       GetRandomVal::unif._M_param._M_a;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  __return_storage_ptr__->defaultVal = 0.0;
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}